

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger get_allowed_args_count(SQObject *closure,SQInteger num_supported)

{
  long lVar1;
  SQInteger nParamsCheck;
  SQInteger num_supported_local;
  SQObject *closure_local;
  long local_8;
  
  if (closure->_type == OT_CLOSURE) {
    local_8 = ((closure->_unVal).pClosure)->_function->_nparameters;
  }
  else if (closure->_type == OT_NATIVECLOSURE) {
    lVar1 = ((closure->_unVal).pNativeClosure)->_nparamscheck;
    local_8 = num_supported;
    if (0 < lVar1) {
      local_8 = lVar1;
    }
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

static SQInteger get_allowed_args_count(SQObject &closure, SQInteger num_supported)
{
    if(sq_type(closure) == OT_CLOSURE) {
        return _closure(closure)->_function->_nparameters;
    }
    else if (sq_type(closure) == OT_NATIVECLOSURE) {
        SQInteger nParamsCheck = _nativeclosure(closure)->_nparamscheck;
        if (nParamsCheck > 0)
            return nParamsCheck;
        else // push all params when there is no check or only minimal count set
            return num_supported;
    }
    assert(false);
    return -1;
}